

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O0

boolean allow_category(obj *obj)

{
  boolean bVar1;
  char *pcVar2;
  bool bVar3;
  boolean priest;
  obj *obj_local;
  
  if (iflags.menu_match_tight == '\0') {
    bVar3 = urole.malenum == 0x161;
    pcVar2 = strchr(valid_menu_classes,0x75);
    if (((pcVar2 == (char *)0x0) || ((*(uint *)&obj->field_0x4a >> 2 & 1) == 0)) &&
       (pcVar2 = strchr(valid_menu_classes,(int)obj->oclass), pcVar2 == (char *)0x0)) {
      pcVar2 = strchr(valid_menu_classes,0x55);
      if ((((pcVar2 == (char *)0x0) || (obj->oclass == '\f')) ||
          ((!bVar3 && ((*(uint *)&obj->field_0x4a >> 6 & 1) == 0)))) ||
         (((*(uint *)&obj->field_0x4a >> 1 & 1) != 0 || ((*(uint *)&obj->field_0x4a & 1) != 0)))) {
        pcVar2 = strchr(valid_menu_classes,0x42);
        if ((pcVar2 == (char *)0x0) ||
           ((obj->oclass == '\f' ||
            (((!bVar3 && ((*(uint *)&obj->field_0x4a >> 6 & 1) == 0)) ||
             ((*(uint *)&obj->field_0x4a >> 1 & 1) == 0)))))) {
          pcVar2 = strchr(valid_menu_classes,0x43);
          if ((((pcVar2 == (char *)0x0) || (obj->oclass == '\f')) ||
              ((!bVar3 && ((*(uint *)&obj->field_0x4a >> 6 & 1) == 0)))) ||
             ((*(uint *)&obj->field_0x4a & 1) == 0)) {
            pcVar2 = strchr(valid_menu_classes,0x58);
            if (((pcVar2 == (char *)0x0) || (obj->oclass == '\f')) ||
               ((bVar3 || ((*(uint *)&obj->field_0x4a >> 6 & 1) != 0)))) {
              pcVar2 = strchr(valid_menu_classes,0x49);
              if ((pcVar2 == (char *)0x0) ||
                 (bVar1 = not_fully_identified_core(obj,'\x01'), bVar1 == '\0')) {
                obj_local._7_1_ = '\0';
              }
              else {
                obj_local._7_1_ = '\x01';
              }
            }
            else {
              obj_local._7_1_ = '\x01';
            }
          }
          else {
            obj_local._7_1_ = '\x01';
          }
        }
        else {
          obj_local._7_1_ = '\x01';
        }
      }
      else {
        obj_local._7_1_ = '\x01';
      }
    }
    else {
      obj_local._7_1_ = '\x01';
    }
  }
  else {
    pcVar2 = strchr(valid_menu_classes,(int)obj->oclass);
    if (pcVar2 == (char *)0x0) {
      obj_local._7_1_ = '\0';
    }
    else if (obj->oclass == '\f') {
      obj_local._7_1_ = '\x01';
    }
    else {
      if ((urole.malenum == 0x161) || ((*(uint *)&obj->field_0x4a >> 6 & 1) != 0)) {
        pcVar2 = strchr(valid_menu_classes,0x42);
        if ((pcVar2 != (char *)0x0) && ((*(uint *)&obj->field_0x4a >> 1 & 1) != 0)) {
          return '\x01';
        }
        pcVar2 = strchr(valid_menu_classes,0x43);
        if ((pcVar2 != (char *)0x0) && ((*(uint *)&obj->field_0x4a & 1) != 0)) {
          return '\x01';
        }
        pcVar2 = strchr(valid_menu_classes,0x55);
        if (((pcVar2 != (char *)0x0) && ((*(uint *)&obj->field_0x4a >> 1 & 1) == 0)) &&
           ((*(uint *)&obj->field_0x4a & 1) == 0)) {
          return '\x01';
        }
      }
      else {
        pcVar2 = strchr(valid_menu_classes,0x58);
        if (pcVar2 != (char *)0x0) {
          return '\x01';
        }
      }
      pcVar2 = strchr(valid_menu_classes,0x75);
      if (((pcVar2 == (char *)0x0) || ((*(uint *)&obj->field_0x4a >> 2 & 1) == 0)) &&
         ((pcVar2 = strchr(valid_menu_classes,0x49), pcVar2 == (char *)0x0 ||
          (bVar1 = not_fully_identified_core(obj,'\x01'), bVar1 == '\0')))) {
        obj_local._7_1_ = '\0';
      }
      else {
        obj_local._7_1_ = '\x01';
      }
    }
  }
  return obj_local._7_1_;
}

Assistant:

boolean allow_category(const struct obj *obj)
{
	if (iflags.menu_match_tight) {
	    /* object class match failure */
	    if (!strchr(valid_menu_classes, obj->oclass))
		return FALSE;

	    /* none of the below apply to gold */
	    if (obj->oclass == COIN_CLASS)
		return TRUE;

	    /* match BUC flags */
	    if (Role_if(PM_PRIEST) || obj->bknown) {
		if (strchr(valid_menu_classes, 'B') && obj->blessed)
		    return TRUE;
		if (strchr(valid_menu_classes, 'C') && obj->cursed)
		    return TRUE;
		if (strchr(valid_menu_classes, 'U') && !obj->blessed && !obj->cursed)
		    return TRUE;
	    } else {
		if (strchr(valid_menu_classes, 'X'))
		    return TRUE;
	    }

	    /* match unpaid or unIDed */
	    if ((strchr(valid_menu_classes, 'u') && obj->unpaid) ||
		(strchr(valid_menu_classes, 'I') &&
		 not_fully_identified_core(obj, TRUE)))
		return TRUE;

	    return FALSE;
	} else {
	    /* Classic (loose) matching behavior. */
	    boolean priest = Role_if(PM_PRIEST);
	    if ((strchr(valid_menu_classes,'u') && obj->unpaid) ||
		strchr(valid_menu_classes, obj->oclass))
		return TRUE;
	    else if (strchr(valid_menu_classes,'U') && obj->oclass != COIN_CLASS &&
		     (priest || obj->bknown) && !obj->blessed && !obj->cursed)
		return TRUE;
	    else if (strchr(valid_menu_classes,'B') && obj->oclass != COIN_CLASS &&
		     (priest || obj->bknown) && obj->blessed)
		return TRUE;
	    else if (strchr(valid_menu_classes,'C') && obj->oclass != COIN_CLASS &&
		     (priest || obj->bknown) && obj->cursed)
		return TRUE;
	    else if (strchr(valid_menu_classes,'X') && obj->oclass != COIN_CLASS &&
		     !(priest || obj->bknown))
		return TRUE;
	    else if (strchr(valid_menu_classes,'I') &&
		     not_fully_identified_core(obj, TRUE))
		return TRUE;
	    else
		return FALSE;
	}
}